

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_Int3Product_Test::TestBody(VectorsTest_Int3Product_Test *this)

{
  bool bVar1;
  Vector3<int> VVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Int3 res;
  Int3 v2;
  Int3 v1;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertHelper *this_00;
  Vector3<int> *in_stack_fffffffffffffeb8;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined1 uVar4;
  char *in_stack_fffffffffffffec8;
  int line;
  char *in_stack_fffffffffffffed0;
  char *file;
  undefined8 in_stack_fffffffffffffed8;
  Type TVar5;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 uVar6;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 uVar7;
  Vector3<int> local_d4;
  AssertionResult local_c8 [2];
  Vector3<int> local_a4;
  AssertionResult local_98;
  uint local_84;
  Vector3<int> local_5c;
  AssertionResult local_50;
  Vector3<int> local_40;
  undefined8 local_30;
  AssertHelper local_28;
  Vector3<int> local_20;
  Vector3<int> local_14;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  pica::Vector3<int>::Vector3(&local_14,3,5,-2);
  pica::Vector3<int>::Vector3(&local_20,6,-8,2);
  VVar2 = pica::operator*((Vector3<int> *)
                          CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffeb8);
  local_40.z = VVar2.z;
  local_28.data_._0_4_ = local_40.z;
  local_40._0_8_ = VVar2._0_8_;
  local_30._0_4_ = local_40.x;
  local_30._4_4_ = local_40.y;
  local_40 = VVar2;
  pica::Vector3<int>::Vector3(&local_5c,0x12,-0x28,-4);
  this_01 = &local_50;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffec8,
             (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             &in_stack_fffffffffffffeb8->x,(int *)in_stack_fffffffffffffeb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar7 = bVar1;
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1d8b7f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),TVar5,
               in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar7,in_stack_ffffffffffffff10),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffeb0);
    testing::Message::~Message((Message *)0x1d8bdc);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8c4a);
  if (local_84 == 0) {
    file = (char *)((long)&local_30 + 4);
    pica::Vector3<int>::Vector3(&local_a4,0x12,-0x28,-4);
    pAVar3 = &local_98;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffec8,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               &in_stack_fffffffffffffeb8->x,(int *)in_stack_fffffffffffffeb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    TVar5 = (Type)((ulong)pAVar3 >> 0x20);
    uVar6 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffee0));
      in_stack_fffffffffffffec8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1d8d18);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffee0),TVar5,file,
                 (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar7,in_stack_ffffffffffffff10),(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffeb0);
      testing::Message::~Message((Message *)0x1d8d75);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8de3);
    if (local_84 == 0) {
      this_00 = &local_28;
      pica::Vector3<int>::Vector3(&local_d4,0x12,-0x28,-4);
      pAVar3 = local_c8;
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_fffffffffffffec8,
                 (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),(int *)pAVar3
                 ,(int *)this_00);
      line = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
      if (!bVar1) {
        uVar4 = bVar1;
        testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffee0));
        testing::AssertionResult::failure_message((AssertionResult *)0x1d8eae);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffee0),TVar5,file,line,
                   (char *)CONCAT17(uVar4,in_stack_fffffffffffffec0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar7,in_stack_ffffffffffffff10),(Message *)this_01);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1d8efa);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8f5f);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3Product)
{
    Int3 v1(3, 5, -2), v2(6, -8, 2);
    Int3 res = v1 * v2;
    ASSERT_EQ_INT3(res, Int3(18, -40, -4));
}